

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationDataBuilder::addConditionalCE32
          (CollationDataBuilder *this,UnicodeString *context,uint32_t ce32,UErrorCode *errorCode)

{
  UBool UVar1;
  ConditionalCE32 *this_00;
  UnicodeString *size;
  ConditionalCE32 *local_70;
  ConditionalCE32 *cond;
  int32_t index;
  UErrorCode *errorCode_local;
  uint32_t ce32_local;
  UnicodeString *context_local;
  CollationDataBuilder *this_local;
  
  size = context;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    this_local._4_4_ = UVector::size(&this->conditionalCE32s);
    if (this_local._4_4_ < 0x80000) {
      this_00 = (ConditionalCE32 *)UMemory::operator_new((UMemory *)0x58,(size_t)size);
      local_70 = (ConditionalCE32 *)0x0;
      if (this_00 != (ConditionalCE32 *)0x0) {
        ConditionalCE32::ConditionalCE32(this_00,context,ce32);
        local_70 = this_00;
      }
      if (local_70 == (ConditionalCE32 *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
        this_local._4_4_ = -1;
      }
      else {
        UVector::addElement(&this->conditionalCE32s,local_70,errorCode);
      }
    }
    else {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationDataBuilder::addConditionalCE32(const UnicodeString &context, uint32_t ce32,
                                         UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return -1; }
    U_ASSERT(!context.isEmpty());
    int32_t index = conditionalCE32s.size();
    if(index > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return -1;
    }
    ConditionalCE32 *cond = new ConditionalCE32(context, ce32);
    if(cond == NULL) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        return -1;
    }
    conditionalCE32s.addElement(cond, errorCode);
    return index;
}